

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

bool llama_model_load(string *fname,llama_model *model,gpt_vocab *vocab,int n_ctx)

{
  int32_t *__k;
  int32_t *piVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  *this;
  ggml_type type;
  uint uVar2;
  mapped_type pgVar3;
  pointer plVar4;
  void *pvVar5;
  int32_t aiVar6 [2];
  int32_t aiVar7 [2];
  int32_t iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  mapped_type *pmVar12;
  mapped_type *this_00;
  ggml_context *pgVar13;
  ggml_tensor *pgVar14;
  mapped_type *ppgVar15;
  size_t sVar16;
  size_t sVar17;
  iterator iVar18;
  size_type sVar19;
  ulong uVar20;
  pointer pcVar21;
  ulong uVar22;
  int i;
  uint uVar23;
  _Alloc_hider _Var24;
  int i1;
  int iVar25;
  long lVar26;
  char *__format;
  int iVar27;
  int *piVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  FILE *__stream;
  bool bVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  ggml_init_params params;
  allocator<char> local_5b9;
  ulong local_5b8;
  int32_t ne [2];
  ulong local_5a8;
  int32_t n_dims;
  string fname_part;
  uint32_t len;
  int32_t length;
  string *local_500;
  undefined8 local_4f8;
  undefined8 local_4e8;
  float local_4d8;
  undefined4 uStack_4d4;
  float local_4bc;
  float local_4b8;
  int32_t ftype;
  vector<char,_std::allocator<char>_> f_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp;
  uint32_t magic;
  size_type local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430 [31];
  ifstream fin;
  long local_228 [2];
  uint auStack_218 [122];
  
  fprintf(_stderr,"%s: loading model from \'%s\' - please wait ...\n","llama_model_load",
          (fname->_M_dataplus)._M_p);
  std::vector<char,_std::allocator<char>_>::vector(&f_buf,0x100000,(allocator_type *)&fin);
  local_500 = fname;
  std::ifstream::ifstream(&fin,(string *)fname,_S_bin);
  (**(code **)(local_228[0] + 0x18))
            (local_228,
             f_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(long)f_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)f_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
  if ((*(byte *)((long)auStack_218 + *(long *)(_fin + -0x18)) & 5) == 0) {
    std::istream::read((char *)&fin,(long)&magic);
    if (magic == 0x67676d6c) {
      std::istream::read((char *)&fin,(long)model);
      __k = &(model->hparams).n_embd;
      std::istream::read((char *)&fin,(long)__k);
      std::istream::read((char *)&fin,(long)&(model->hparams).n_mult);
      std::istream::read((char *)&fin,(long)&(model->hparams).n_head);
      std::istream::read((char *)&fin,(long)&(model->hparams).n_layer);
      std::istream::read((char *)&fin,(long)&(model->hparams).n_rot);
      piVar1 = &(model->hparams).f16;
      std::istream::read((char *)&fin,(long)piVar1);
      (model->hparams).n_ctx = n_ctx;
      iVar25 = (model->hparams).n_mult;
      iVar27 = ((model->hparams).n_embd << 3) / 3 + iVar25 + -1;
      pmVar12 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                          (&LLAMA_N_PARTS,__k);
      iVar27 = iVar27 - iVar27 % iVar25;
      local_5b8 = (ulong)*pmVar12;
      iVar25 = (model->hparams).n_vocab;
      _magic = (pointer)local_430;
      local_438 = 0;
      local_430[0]._M_local_buf[0] = '\0';
      for (fname_part._M_dataplus._M_p._0_4_ = 0; (int)fname_part._M_dataplus._M_p < iVar25;
          fname_part._M_dataplus._M_p._0_4_ = (int)fname_part._M_dataplus._M_p + 1) {
        std::istream::read((char *)&fin,(long)&len);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic,
                   (ulong)len);
        std::istream::read((char *)&fin,(long)_magic);
        iVar29 = (int)fname_part._M_dataplus._M_p;
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::operator[](&vocab->token_to_id,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &magic);
        *pmVar12 = iVar29;
        this_00 = std::
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&vocab->id_to_token,(key_type *)&fname_part);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &magic);
      }
      std::__cxx11::string::~string((string *)&magic);
      uVar22 = (ulong)(uint)*piVar1;
      if (uVar22 < 4) {
        type = *(ggml_type *)(&DAT_0012a080 + uVar22 * 4);
        iVar25 = (model->hparams).n_ctx;
        iVar29 = (model->hparams).n_embd;
        iVar9 = (model->hparams).n_layer;
        iVar10 = (model->hparams).n_vocab;
        local_4b8 = ggml_type_sizef(type);
        fVar33 = ggml_type_sizef(GGML_TYPE_F32);
        local_4bc = ggml_type_sizef(type);
        fVar34 = ggml_type_sizef(GGML_TYPE_F32);
        fVar35 = ggml_type_sizef(type);
        fVar36 = ggml_type_sizef(type);
        local_4f8._0_4_ = ggml_type_sizef(type);
        local_4f8._4_4_ = extraout_XMM0_Db;
        local_4d8 = ggml_type_sizef(type);
        uStack_4d4 = extraout_XMM0_Db_00;
        local_4e8._0_4_ = ggml_type_sizef(GGML_TYPE_F32);
        local_4e8._4_4_ = extraout_XMM0_Db_01;
        fVar37 = ggml_type_sizef(type);
        fVar38 = ggml_type_sizef(type);
        fVar39 = ggml_type_sizef(type);
        fVar40 = ggml_type_sizef(GGML_TYPE_F32);
        fVar41 = ggml_type_sizef(GGML_TYPE_F32);
        fVar48 = (float)(iVar10 * iVar29);
        fVar46 = (float)iVar29;
        fVar45 = local_4b8 * fVar48 + 0.0;
        uVar22 = (ulong)fVar45;
        fVar45 = fVar33 * fVar46 +
                 (float)((long)(fVar45 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22);
        uVar22 = (ulong)fVar45;
        fVar47 = (float)(iVar29 * iVar29);
        fVar33 = (float)iVar9;
        fVar45 = fVar48 * local_4bc +
                 (float)((long)(fVar45 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22);
        uVar22 = (ulong)fVar45;
        fVar34 = fVar34 * fVar46 * fVar33 +
                 (float)((long)(fVar45 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22);
        uVar22 = (ulong)fVar34;
        fVar34 = fVar35 * fVar47 * fVar33 +
                 (float)((long)(fVar34 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22);
        uVar22 = (ulong)fVar34;
        fVar34 = fVar36 * fVar47 * fVar33 +
                 (float)((long)(fVar34 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22);
        uVar22 = (ulong)fVar34;
        local_4f8._0_4_ = (float)local_4f8 * fVar47;
        fVar34 = (float)local_4f8 * fVar33 +
                 (float)((long)(fVar34 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22);
        uVar22 = (ulong)fVar34;
        local_4d8 = local_4d8 * fVar47;
        fVar35 = (float)(iVar29 * iVar27);
        fVar34 = local_4d8 * fVar33 +
                 (float)((long)(fVar34 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22);
        uVar22 = (ulong)fVar34;
        local_4e8._0_4_ = (float)local_4e8 * fVar46;
        fVar34 = (float)local_4e8 * fVar33 +
                 (float)((long)(fVar34 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22);
        uVar22 = (ulong)fVar34;
        fVar34 = fVar37 * fVar35 * fVar33 +
                 (float)((long)(fVar34 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22);
        uVar22 = (ulong)fVar34;
        fVar36 = fVar38 * fVar35 * fVar33 +
                 (float)((long)(fVar34 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22);
        uVar22 = (ulong)fVar36;
        fVar34 = (float)(iVar29 * iVar9 * iVar25);
        fVar33 = fVar33 * fVar39 * fVar35 +
                 (float)((long)(fVar36 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22);
        uVar22 = (ulong)fVar33;
        fVar33 = fVar40 * fVar34 +
                 (float)((long)(fVar33 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22);
        uVar22 = (ulong)fVar33;
        fVar33 = fVar34 * fVar41 +
                 (float)((long)(fVar33 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22);
        uVar22 = (ulong)fVar33;
        uVar22 = (long)(iVar9 * 0xa00 + 0x500) +
                 ((long)(fVar33 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22);
        auVar42._8_4_ = (int)(uVar22 >> 0x20);
        auVar42._0_8_ = uVar22;
        auVar42._12_4_ = 0x45300000;
        fprintf(_stderr,"%s: ggml ctx size = %6.2f MB\n",
                SUB84(((auVar42._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar22) - 4503599627370496.0)) *
                      9.5367431640625e-07,0),"llama_model_load");
        params.mem_buffer = (void *)0x0;
        params.mem_size = uVar22;
        pgVar13 = ggml_init(params);
        model->ctx = pgVar13;
        if (pgVar13 == (ggml_context *)0x0) {
          bVar32 = false;
          fprintf(_stderr,"%s: ggml_init() failed\n","llama_model_load");
        }
        else {
          iVar25 = (model->hparams).n_vocab;
          iVar29 = (model->hparams).n_embd;
          uVar23 = (model->hparams).n_layer;
          std::vector<llama_layer,_std::allocator<llama_layer>_>::resize
                    (&model->layers,(long)(int)uVar23);
          pgVar14 = ggml_new_tensor_2d(model->ctx,type,iVar29,iVar25);
          model->tok_embeddings = pgVar14;
          pgVar14 = ggml_new_tensor_1d(model->ctx,GGML_TYPE_F32,iVar29);
          model->norm = pgVar14;
          pgVar14 = ggml_new_tensor_2d(model->ctx,type,iVar29,iVar25);
          model->output = pgVar14;
          pgVar3 = model->tok_embeddings;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&magic,"tok_embeddings.weight",(allocator<char> *)&fname_part);
          this = &model->tensors;
          ppgVar15 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](this,(key_type *)&magic);
          *ppgVar15 = pgVar3;
          std::__cxx11::string::~string((string *)&magic);
          pgVar3 = model->norm;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&magic,"norm.weight",(allocator<char> *)&fname_part);
          ppgVar15 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](this,(key_type *)&magic);
          *ppgVar15 = pgVar3;
          std::__cxx11::string::~string((string *)&magic);
          pgVar3 = model->output;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&magic,"output.weight",(allocator<char> *)&fname_part);
          local_4e8 = CONCAT44(local_4e8._4_4_,iVar29);
          _local_4d8 = CONCAT44(uStack_4d4,type);
          ppgVar15 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](this,(key_type *)&magic);
          *ppgVar15 = pgVar3;
          std::__cxx11::string::~string((string *)&magic);
          uVar22 = 0;
          if ((int)uVar23 < 1) {
            uVar23 = 0;
          }
          local_4f8 = (ulong)uVar23;
          lVar30 = 0x40;
          for (; local_4f8 != uVar22; uVar22 = uVar22 + 1) {
            plVar4 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            iVar25 = (int)(float)local_4e8;
            pgVar14 = ggml_new_tensor_1d(model->ctx,GGML_TYPE_F32,(int)(float)local_4e8);
            fVar33 = local_4d8;
            *(ggml_tensor **)((long)plVar4 + lVar30 + -0x40) = pgVar14;
            pgVar14 = ggml_new_tensor_2d(model->ctx,(ggml_type)local_4d8,iVar25,iVar25);
            *(ggml_tensor **)((long)plVar4 + lVar30 + -0x38) = pgVar14;
            pgVar14 = ggml_new_tensor_2d(model->ctx,(ggml_type)fVar33,iVar25,iVar25);
            *(ggml_tensor **)((long)plVar4 + lVar30 + -0x30) = pgVar14;
            pgVar14 = ggml_new_tensor_2d(model->ctx,(ggml_type)fVar33,iVar25,iVar25);
            *(ggml_tensor **)((long)plVar4 + lVar30 + -0x28) = pgVar14;
            pgVar14 = ggml_new_tensor_2d(model->ctx,(ggml_type)fVar33,iVar25,iVar25);
            *(ggml_tensor **)((long)plVar4 + lVar30 + -0x20) = pgVar14;
            pgVar14 = ggml_new_tensor_1d(model->ctx,GGML_TYPE_F32,iVar25);
            *(ggml_tensor **)((long)plVar4 + lVar30 + -0x18) = pgVar14;
            pgVar14 = ggml_new_tensor_2d(model->ctx,(ggml_type)fVar33,iVar25,iVar27);
            *(ggml_tensor **)((long)plVar4 + lVar30 + -0x10) = pgVar14;
            pgVar14 = ggml_new_tensor_2d(model->ctx,(ggml_type)fVar33,iVar27,iVar25);
            *(ggml_tensor **)((long)plVar4 + lVar30 + -8) = pgVar14;
            pgVar14 = ggml_new_tensor_2d(model->ctx,(ggml_type)fVar33,iVar25,iVar27);
            *(ggml_tensor **)((long)&plVar4->attention_norm + lVar30) = pgVar14;
            pgVar3 = *(mapped_type *)((long)plVar4 + lVar30 + -0x40);
            iVar25 = (int)uVar22;
            std::__cxx11::to_string((string *)&len,iVar25);
            std::operator+(&fname_part,"layers.",(string *)&len);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &magic,&fname_part,".attention_norm.weight");
            ppgVar15 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&magic);
            *ppgVar15 = pgVar3;
            std::__cxx11::string::~string((string *)&magic);
            std::__cxx11::string::~string((string *)&fname_part);
            std::__cxx11::string::~string((string *)&len);
            pgVar3 = *(mapped_type *)((long)plVar4 + lVar30 + -0x38);
            std::__cxx11::to_string((string *)&len,iVar25);
            std::operator+(&fname_part,"layers.",(string *)&len);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &magic,&fname_part,".attention.wq.weight");
            ppgVar15 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&magic);
            *ppgVar15 = pgVar3;
            std::__cxx11::string::~string((string *)&magic);
            std::__cxx11::string::~string((string *)&fname_part);
            std::__cxx11::string::~string((string *)&len);
            pgVar3 = *(mapped_type *)((long)plVar4 + lVar30 + -0x30);
            std::__cxx11::to_string((string *)&len,iVar25);
            std::operator+(&fname_part,"layers.",(string *)&len);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &magic,&fname_part,".attention.wk.weight");
            ppgVar15 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&magic);
            *ppgVar15 = pgVar3;
            std::__cxx11::string::~string((string *)&magic);
            std::__cxx11::string::~string((string *)&fname_part);
            std::__cxx11::string::~string((string *)&len);
            pgVar3 = *(mapped_type *)((long)plVar4 + lVar30 + -0x28);
            std::__cxx11::to_string((string *)&len,iVar25);
            std::operator+(&fname_part,"layers.",(string *)&len);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &magic,&fname_part,".attention.wv.weight");
            ppgVar15 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&magic);
            *ppgVar15 = pgVar3;
            std::__cxx11::string::~string((string *)&magic);
            std::__cxx11::string::~string((string *)&fname_part);
            std::__cxx11::string::~string((string *)&len);
            pgVar3 = *(mapped_type *)((long)plVar4 + lVar30 + -0x20);
            std::__cxx11::to_string((string *)&len,iVar25);
            std::operator+(&fname_part,"layers.",(string *)&len);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &magic,&fname_part,".attention.wo.weight");
            ppgVar15 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&magic);
            *ppgVar15 = pgVar3;
            std::__cxx11::string::~string((string *)&magic);
            std::__cxx11::string::~string((string *)&fname_part);
            std::__cxx11::string::~string((string *)&len);
            pgVar3 = *(mapped_type *)((long)plVar4 + lVar30 + -0x18);
            std::__cxx11::to_string((string *)&len,iVar25);
            std::operator+(&fname_part,"layers.",(string *)&len);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &magic,&fname_part,".ffn_norm.weight");
            ppgVar15 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&magic);
            *ppgVar15 = pgVar3;
            std::__cxx11::string::~string((string *)&magic);
            std::__cxx11::string::~string((string *)&fname_part);
            std::__cxx11::string::~string((string *)&len);
            pgVar3 = *(mapped_type *)((long)plVar4 + lVar30 + -0x10);
            std::__cxx11::to_string((string *)&len,iVar25);
            std::operator+(&fname_part,"layers.",(string *)&len);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &magic,&fname_part,".feed_forward.w1.weight");
            ppgVar15 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&magic);
            *ppgVar15 = pgVar3;
            std::__cxx11::string::~string((string *)&magic);
            std::__cxx11::string::~string((string *)&fname_part);
            std::__cxx11::string::~string((string *)&len);
            pgVar3 = *(mapped_type *)((long)plVar4 + lVar30 + -8);
            std::__cxx11::to_string((string *)&len,iVar25);
            std::operator+(&fname_part,"layers.",(string *)&len);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &magic,&fname_part,".feed_forward.w2.weight");
            ppgVar15 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&magic);
            *ppgVar15 = pgVar3;
            std::__cxx11::string::~string((string *)&magic);
            std::__cxx11::string::~string((string *)&fname_part);
            std::__cxx11::string::~string((string *)&len);
            pgVar3 = *(mapped_type *)((long)&plVar4->attention_norm + lVar30);
            std::__cxx11::to_string((string *)&len,iVar25);
            std::operator+(&fname_part,"layers.",(string *)&len);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &magic,&fname_part,".feed_forward.w3.weight");
            ppgVar15 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&magic);
            *ppgVar15 = pgVar3;
            std::__cxx11::string::~string((string *)&magic);
            std::__cxx11::string::~string((string *)&fname_part);
            std::__cxx11::string::~string((string *)&len);
            lVar30 = lVar30 + 0x48;
          }
          uVar23 = (model->hparams).n_ctx * (model->hparams).n_layer;
          iVar25 = (model->hparams).n_embd * uVar23;
          pgVar14 = ggml_new_tensor_1d(model->ctx,GGML_TYPE_F32,iVar25);
          model->memory_k = pgVar14;
          pgVar14 = ggml_new_tensor_1d(model->ctx,GGML_TYPE_F32,iVar25);
          model->memory_v = pgVar14;
          sVar16 = ggml_nbytes(model->memory_k);
          sVar17 = ggml_nbytes(model->memory_v);
          lVar30 = sVar17 + sVar16;
          auVar43._8_4_ = (int)((ulong)lVar30 >> 0x20);
          auVar43._0_8_ = lVar30;
          auVar43._12_4_ = 0x45300000;
          fprintf(_stderr,"%s: memory_size = %8.2f MB, n_mem = %d\n",
                  SUB84(((auVar43._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar30) - 4503599627370496.0)) *
                        0.0009765625 * 0.0009765625,0),"llama_model_load",(ulong)uVar23);
          local_4e8 = std::istream::tellg();
          std::ifstream::close();
          tmp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          iVar25 = 0;
          if (0 < (int)local_5b8) {
            iVar25 = (int)local_5b8;
          }
          tmp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          tmp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          fVar33 = (float)0;
          do {
            iVar27 = (int)fVar33;
            if (iVar27 == iVar25) break;
            std::__cxx11::string::string((string *)&fname_part,local_500);
            if (iVar27 != 0) {
              std::__cxx11::to_string((string *)&len,iVar27);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &magic,".",(string *)&len);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&fname_part,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic);
              std::__cxx11::string::~string((string *)&magic);
              std::__cxx11::string::~string((string *)&len);
            }
            _local_4d8 = CONCAT44(uStack_4d4,iVar27 + 1U);
            fprintf(_stderr,"%s: loading model part %d/%d from \'%s\'\n","llama_model_load",
                    (ulong)(iVar27 + 1U),local_5b8,
                    CONCAT44(fname_part._M_dataplus._M_p._4_4_,(int)fname_part._M_dataplus._M_p));
            std::ifstream::ifstream
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic,
                       (string *)&fname_part,_S_bin);
            std::ifstream::operator=(&fin,(ifstream *)&magic);
            std::ifstream::~ifstream
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic);
            (**(code **)(local_228[0] + 0x18))
                      (local_228,
                       f_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (long)f_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)f_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
            std::istream::seekg(&fin,local_4e8,0);
            local_5a8 = 0;
            fprintf(_stderr,"%s: ","llama_model_load");
            local_4f8 = 0;
            while( true ) {
              std::istream::read((char *)&fin,(long)&n_dims);
              std::istream::read((char *)&fin,(long)&length);
              std::istream::read((char *)&fin,(long)&ftype);
              uVar23 = *(uint *)((long)auStack_218 + *(long *)(_fin + -0x18));
              if ((uVar23 & 2) != 0) break;
              ne[0] = 1;
              ne[1] = 1;
              piVar28 = ne;
              iVar29 = 1;
              for (lVar30 = 0; lVar30 < n_dims; lVar30 = lVar30 + 1) {
                std::istream::read((char *)&fin,(long)piVar28);
                iVar29 = iVar29 * *piVar28;
                piVar28 = piVar28 + 1;
              }
              _magic = (pointer)local_430;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &magic,(long)length,'\0');
              std::istream::read((char *)&fin,(long)_magic);
              std::__cxx11::string::string<std::allocator<char>>((string *)&len,_magic,&local_5b9);
              iVar18 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::find(&this->_M_t,(key_type *)&len);
              std::__cxx11::string::~string((string *)&len);
              if ((_Rb_tree_header *)iVar18._M_node ==
                  &(model->tensors)._M_t._M_impl.super__Rb_tree_header) {
                fprintf(_stderr,"%s: unknown tensor \'%s\' in model file\n","llama_model_load",
                        _magic);
LAB_001080cc:
                std::__cxx11::string::~string((string *)&magic);
                goto LAB_001080d9;
              }
              sVar19 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&magic,"tok_embeddings",0);
              bVar32 = true;
              if (sVar19 == 0xffffffffffffffff) {
                sVar19 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&magic,"layers",0);
                if (sVar19 == 0xffffffffffffffff) {
                  sVar19 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,"output",0);
                  bVar32 = sVar19 == 0xffffffffffffffff;
                }
                else {
                  sVar19 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,"attention.wo.weight",0);
                  if (sVar19 == 0xffffffffffffffff) {
                    sVar19 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&magic,"feed_forward.w2.weight",0);
                    bVar32 = sVar19 != 0xffffffffffffffff;
                  }
                }
              }
              std::__cxx11::string::string<std::allocator<char>>((string *)&len,_magic,&local_5b9);
              ppgVar15 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(key_type *)&len);
              pgVar14 = *ppgVar15;
              std::__cxx11::string::~string((string *)&len);
              if (n_dims == 1) {
                iVar9 = ggml_nelements(pgVar14);
              }
              else {
                iVar9 = ggml_nelements(pgVar14);
                iVar9 = iVar9 / (int)local_5b8;
              }
              if (iVar9 != iVar29) {
                fprintf(_stderr,"%s: tensor \'%s\' has wrong size in model file\n",
                        "llama_model_load",_magic);
                goto LAB_001080cc;
              }
              uVar2 = pgVar14->ne[0];
              uVar22 = (ulong)uVar2;
              if (n_dims == 1) {
                uVar11 = pgVar14->ne[1];
                uVar20 = (ulong)ne & 0xffffffff;
                if ((uVar2 != ne[0]) || (uVar20 = uVar22, uVar11 != ne[1])) goto LAB_001080b1;
              }
              else if (bVar32) {
                aiVar6 = (int32_t  [2])((long)(int)uVar2 / (long)(int)local_5b8);
                uVar11 = pgVar14->ne[1];
                aiVar7 = ne;
                if ((aiVar6[0] != ne[0]) || (aiVar7 = aiVar6, uVar11 != ne[1])) {
                  uVar22 = (ulong)aiVar6 & 0xffffffff;
                  uVar20 = (ulong)aiVar7 & 0xffffffff;
LAB_001080b1:
                  fprintf(_stderr,
                          "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n"
                          ,"llama_model_load",_magic,uVar22,(ulong)uVar11,uVar20,(ulong)(uint)ne[1])
                  ;
                  goto LAB_001080cc;
                }
              }
              else {
                uVar20 = (ulong)ne & 0xffffffff;
                if ((uVar2 != ne[0]) || (uVar20 = uVar22, pgVar14->ne[1] / (int)local_5b8 != ne[1]))
                {
                  uVar11 = pgVar14->ne[1] / (int)local_5b8;
                  goto LAB_001080b1;
                }
              }
              if (3 < (ulong)(uint)ftype) {
                fprintf(_stderr,"%s: unknown ftype %d in model file\n","llama_model_load");
                goto LAB_001080cc;
              }
              sVar16 = ggml_type_size(*(ggml_type *)(&DAT_0012a080 + (ulong)(uint)ftype * 4));
              uVar22 = sVar16 * (long)iVar29;
              if ((n_dims == 1) || ((int)local_5b8 == 1)) {
                iVar29 = ggml_blck_size(pgVar14->type);
                sVar16 = ggml_nbytes(pgVar14);
                _Var24._M_p = _magic;
                __stream = _stderr;
                if (uVar22 / (ulong)(long)iVar29 != sVar16) {
                  uVar20 = ggml_nbytes(pgVar14);
                  goto LAB_00108011;
                }
                if (iVar27 == 0) {
                  pvVar5 = pgVar14->data;
                  ggml_nbytes(pgVar14);
                  std::istream::read((char *)&fin,(long)pvVar5);
                }
                else {
                  sVar16 = ggml_nbytes(pgVar14);
                  std::istream::seekg((long)&fin,(_Ios_Seekdir)sVar16);
                }
                uVar22 = ggml_nbytes(pgVar14);
              }
              else {
                iVar29 = ggml_blck_size(pgVar14->type);
                sVar16 = ggml_nbytes(pgVar14);
                _Var24._M_p = _magic;
                __stream = _stderr;
                if (uVar22 / (ulong)(long)iVar29 != sVar16 / local_5b8) {
                  sVar16 = ggml_nbytes(pgVar14);
                  uVar20 = sVar16 / local_5b8;
LAB_00108011:
                  fprintf(__stream,
                          "%s: tensor \'%s\' has wrong size in model file: got %zu, expected %zu\n",
                          "llama_model_load",_Var24._M_p,uVar20,uVar22);
                  goto LAB_001080cc;
                }
                iVar29 = pgVar14->ne[0];
                if (bVar32) {
                  iVar8 = ne[0];
                  iVar9 = ggml_blck_size(pgVar14->type);
                  sVar16 = ggml_type_size(pgVar14->type);
                  lVar30 = 0;
                  for (lVar26 = 0; lVar26 < ne[1]; lVar26 = lVar26 + 1) {
                    iVar10 = ggml_blck_size(pgVar14->type);
                    sVar17 = ggml_type_size(pgVar14->type);
                    std::istream::read((char *)&fin,
                                       (long)pgVar14->data +
                                       lVar30 + sVar17 * (long)((iVar8 * iVar27) / iVar10));
                    lVar30 = lVar30 + sVar16 * (long)(iVar29 / iVar9);
                  }
                }
                else {
                  iVar8 = ne[1];
                  iVar9 = ggml_blck_size(pgVar14->type);
                  sVar16 = ggml_type_size(pgVar14->type);
                  lVar26 = sVar16 * (long)(iVar29 / iVar9);
                  lVar30 = (iVar8 * iVar27) * lVar26;
                  for (lVar31 = 0; lVar31 < ne[1]; lVar31 = lVar31 + 1) {
                    std::istream::read((char *)&fin,(long)pgVar14->data + lVar30);
                    lVar30 = lVar30 + lVar26;
                  }
                }
                sVar16 = ggml_nbytes(pgVar14);
                uVar22 = sVar16 / local_5b8;
              }
              uVar23 = (int)local_5a8 + 1;
              local_5a8 = (ulong)uVar23;
              if ((uVar23 & 7) == 0) {
                fputc(0x2e,_stderr);
                fflush(_stderr);
              }
              local_4f8 = local_4f8 + uVar22;
              std::__cxx11::string::~string((string *)&magic);
            }
            fwrite(" done\n",6,1,_stderr);
            auVar44._0_8_ = (double)CONCAT44(0x43300000,(int)local_4f8);
            auVar44._8_4_ = (int)(local_4f8 >> 0x20);
            auVar44._12_4_ = 0x45300000;
            fprintf(_stderr,"%s: model size = %8.2f MB / num tensors = %d\n",
                    SUB84(((auVar44._8_8_ - 1.9342813113834067e+25) +
                          (auVar44._0_8_ - 4503599627370496.0)) * 0.0009765625 * 0.0009765625,0),
                    "llama_model_load",local_5a8);
            std::ifstream::close();
LAB_001080d9:
            std::__cxx11::string::~string((string *)&fname_part);
            fVar33 = local_4d8;
          } while ((uVar23 & 2) != 0);
          bVar32 = (int)local_5b8 <= iVar27;
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&tmp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        }
      }
      else {
        bVar32 = false;
        fprintf(_stderr,"%s: invalid model file \'%s\' (bad f16 value %d)\n","llama_model_load",
                (local_500->_M_dataplus)._M_p);
      }
      goto LAB_00106aba;
    }
    pcVar21 = (local_500->_M_dataplus)._M_p;
    __format = "%s: invalid model file \'%s\' (bad magic)\n";
  }
  else {
    pcVar21 = (local_500->_M_dataplus)._M_p;
    __format = "%s: failed to open \'%s\'\n";
  }
  bVar32 = false;
  fprintf(_stderr,__format,"llama_model_load",pcVar21);
LAB_00106aba:
  std::ifstream::~ifstream(&fin);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&f_buf.super__Vector_base<char,_std::allocator<char>_>);
  return bVar32;
}

Assistant:

bool llama_model_load(const std::string & fname, llama_model & model, gpt_vocab & vocab, int n_ctx) {
    fprintf(stderr, "%s: loading model from '%s' - please wait ...\n", __func__, fname.c_str());

    std::vector<char> f_buf(1024*1024);

    auto fin = std::ifstream(fname, std::ios::binary);
    fin.rdbuf()->pubsetbuf(f_buf.data(), f_buf.size());
    if (!fin) {
        fprintf(stderr, "%s: failed to open '%s'\n", __func__, fname.c_str());
        return false;
    }

    // verify magic
    {
        uint32_t magic;
        fin.read((char *) &magic, sizeof(magic));
        if (magic != 0x67676d6c) {
            fprintf(stderr, "%s: invalid model file '%s' (bad magic)\n", __func__, fname.c_str());
            return false;
        }
    }

    int n_ff = 0;
    int n_parts = 0;

    // load hparams
    {
        auto & hparams = model.hparams;

        fin.read((char *) &hparams.n_vocab, sizeof(hparams.n_vocab));
        //fin.read((char *) &hparams.n_ctx,   sizeof(hparams.n_ctx));
        fin.read((char *) &hparams.n_embd,  sizeof(hparams.n_embd));
        fin.read((char *) &hparams.n_mult,  sizeof(hparams.n_mult));
        fin.read((char *) &hparams.n_head,  sizeof(hparams.n_head));
        fin.read((char *) &hparams.n_layer, sizeof(hparams.n_layer));
        fin.read((char *) &hparams.n_rot,   sizeof(hparams.n_rot));
        fin.read((char *) &hparams.f16,     sizeof(hparams.f16));

        hparams.n_ctx = n_ctx;

        n_ff = ((2*(4*hparams.n_embd)/3 + hparams.n_mult - 1)/hparams.n_mult)*hparams.n_mult;
        n_parts = LLAMA_N_PARTS.at(hparams.n_embd);

        // fprintf(stderr, "%s: n_vocab = %d\n", __func__, hparams.n_vocab);
        // fprintf(stderr, "%s: n_ctx   = %d\n", __func__, hparams.n_ctx);
        // fprintf(stderr, "%s: n_embd  = %d\n", __func__, hparams.n_embd);
        // fprintf(stderr, "%s: n_mult  = %d\n", __func__, hparams.n_mult);
        // fprintf(stderr, "%s: n_head  = %d\n", __func__, hparams.n_head);
        // fprintf(stderr, "%s: n_layer = %d\n", __func__, hparams.n_layer);
        // fprintf(stderr, "%s: n_rot   = %d\n", __func__, hparams.n_rot);
        // fprintf(stderr, "%s: f16     = %d\n", __func__, hparams.f16);
        // fprintf(stderr, "%s: n_ff    = %d\n", __func__, n_ff);
        // fprintf(stderr, "%s: n_parts = %d\n", __func__, n_parts);
    }

    // load vocab
    {
        const int32_t n_vocab = model.hparams.n_vocab;

        if (n_vocab != model.hparams.n_vocab) {
            fprintf(stderr, "%s: invalid model file '%s' (bad vocab size %d != %d)\n",
                    __func__, fname.c_str(), n_vocab, model.hparams.n_vocab);
            return false;
        }

        std::string word;
        for (int i = 0; i < n_vocab; i++) {
            uint32_t len;
            fin.read((char *) &len, sizeof(len));

            word.resize(len);
            fin.read((char *) word.data(), len);

            vocab.token_to_id[word] = i;
            vocab.id_to_token[i] = word;

            //if (i < 30000) {
            //    fprintf(stderr, "%s: vocab[%d] = '%s'\n", __func__, i, word.c_str());
            //}
        }
    }

    // for the big tensors, we have the option to store the data in 16-bit floats or quantized
    // in order to save memory and also to speed up the computation
    ggml_type wtype = GGML_TYPE_COUNT;
    switch (model.hparams.f16) {
        case 0: wtype = GGML_TYPE_F32;  break;
        case 1: wtype = GGML_TYPE_F16;  break;
        case 2: wtype = GGML_TYPE_Q4_0; break;
        case 3: wtype = GGML_TYPE_Q4_1; break;
        default:
                {
                    fprintf(stderr, "%s: invalid model file '%s' (bad f16 value %d)\n",
                            __func__, fname.c_str(), model.hparams.f16);
                    return false;
                }
    }

    const ggml_type wtype2 = GGML_TYPE_F32;

    auto & ctx = model.ctx;

    size_t ctx_size = 0;

    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        ctx_size += n_embd*n_vocab*ggml_type_sizef(wtype); // tok_embeddings

        ctx_size += n_embd*ggml_type_sizef(GGML_TYPE_F32); // norm

        ctx_size += n_embd*n_vocab*ggml_type_sizef(wtype); // output

        ctx_size += n_layer*(n_embd*ggml_type_sizef(GGML_TYPE_F32)); // attention_norm

        ctx_size += n_layer*(n_embd*n_embd*ggml_type_sizef(wtype)); // wq
        ctx_size += n_layer*(n_embd*n_embd*ggml_type_sizef(wtype)); // wk
        ctx_size += n_layer*(n_embd*n_embd*ggml_type_sizef(wtype)); // wv
        ctx_size += n_layer*(n_embd*n_embd*ggml_type_sizef(wtype)); // wo

        ctx_size += n_layer*(n_embd*ggml_type_sizef(GGML_TYPE_F32)); // ffn_norm

        ctx_size += n_layer*(n_ff*n_embd*ggml_type_sizef(wtype)); // w1
        ctx_size += n_layer*(n_ff*n_embd*ggml_type_sizef(wtype)); // w2
        ctx_size += n_layer*(n_ff*n_embd*ggml_type_sizef(wtype)); // w3

        ctx_size += n_ctx*n_layer*n_embd*ggml_type_sizef(GGML_TYPE_F32); // memory_k
        ctx_size += n_ctx*n_layer*n_embd*ggml_type_sizef(GGML_TYPE_F32); // memory_v

        ctx_size += (5 + 10*n_layer)*256; // object overhead

        fprintf(stderr, "%s: ggml ctx size = %6.2f MB\n", __func__, ctx_size/(1024.0*1024.0));
    }

    // create the ggml context
    {
        struct ggml_init_params params = {
            /*.mem_size   =*/ ctx_size,
            /*.mem_buffer =*/ NULL,
        };

        model.ctx = ggml_init(params);
        if (!model.ctx) {
            fprintf(stderr, "%s: ggml_init() failed\n", __func__);
            return false;
        }
    }

    // prepare memory for the weights
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        model.layers.resize(n_layer);

        model.tok_embeddings = ggml_new_tensor_2d(ctx, wtype, n_embd, n_vocab);

        model.norm   = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);
        model.output = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);

        // map by name
        model.tensors["tok_embeddings.weight"] = model.tok_embeddings;

        model.tensors["norm.weight"]   = model.norm;
        model.tensors["output.weight"] = model.output;

        for (int i = 0; i < n_layer; ++i) {
            auto & layer = model.layers[i];

            layer.attention_norm = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

            layer.wq = ggml_new_tensor_2d(ctx, wtype, n_embd, n_embd);
            layer.wk = ggml_new_tensor_2d(ctx, wtype, n_embd, n_embd);
            layer.wv = ggml_new_tensor_2d(ctx, wtype, n_embd, n_embd);
            layer.wo = ggml_new_tensor_2d(ctx, wtype, n_embd, n_embd);

            layer.ffn_norm = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

            layer.w1 = ggml_new_tensor_2d(ctx, wtype, n_embd,   n_ff);
            layer.w2 = ggml_new_tensor_2d(ctx, wtype,   n_ff, n_embd);
            layer.w3 = ggml_new_tensor_2d(ctx, wtype, n_embd,   n_ff);

            // map by name
            model.tensors["layers." + std::to_string(i) + ".attention_norm.weight"] = layer.attention_norm;

            model.tensors["layers." + std::to_string(i) + ".attention.wq.weight"] = layer.wq;
            model.tensors["layers." + std::to_string(i) + ".attention.wk.weight"] = layer.wk;
            model.tensors["layers." + std::to_string(i) + ".attention.wv.weight"] = layer.wv;
            model.tensors["layers." + std::to_string(i) + ".attention.wo.weight"] = layer.wo;

            model.tensors["layers." + std::to_string(i) + ".ffn_norm.weight"] = layer.ffn_norm;

            model.tensors["layers." + std::to_string(i) + ".feed_forward.w1.weight"] = layer.w1;
            model.tensors["layers." + std::to_string(i) + ".feed_forward.w2.weight"] = layer.w2;
            model.tensors["layers." + std::to_string(i) + ".feed_forward.w3.weight"] = layer.w3;
        }
    }

    // key + value memory
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;

        const int n_mem      = n_layer*n_ctx;
        const int n_elements = n_embd*n_mem;

        model.memory_k = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);
        model.memory_v = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);

        const size_t memory_size = ggml_nbytes(model.memory_k) + ggml_nbytes(model.memory_v);

        fprintf(stderr, "%s: memory_size = %8.2f MB, n_mem = %d\n", __func__, memory_size/1024.0/1024.0, n_mem);
    }

    const size_t file_offset = fin.tellg();

    fin.close();

    std::vector<uint8_t> tmp;
    
    for (int i = 0; i < n_parts; ++i) {
        const int part_id = i;
        //const int part_id = n_parts - i - 1;

        std::string fname_part = fname;
        if (i > 0) {
            fname_part += "." + std::to_string(i);
        }

        fprintf(stderr, "%s: loading model part %d/%d from '%s'\n", __func__, i+1, n_parts, fname_part.c_str());

        fin = std::ifstream(fname_part, std::ios::binary);
        fin.rdbuf()->pubsetbuf(f_buf.data(), f_buf.size());
        fin.seekg(file_offset);

        // load weights
        {
            int n_tensors = 0;
            size_t total_size = 0;

            fprintf(stderr, "%s: ", __func__);

            while (true) {
                int32_t n_dims;
                int32_t length;
                int32_t ftype;

                fin.read(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
                fin.read(reinterpret_cast<char *>(&length), sizeof(length));
                fin.read(reinterpret_cast<char *>(&ftype),  sizeof(ftype));

                if (fin.eof()) {
                    break;
                }

                int32_t nelements = 1;
                int32_t ne[2] = { 1, 1 };
                for (int i = 0; i < n_dims; ++i) {
                    fin.read(reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
                    nelements *= ne[i];
                }

                std::string name(length, 0);
                fin.read(&name[0], length);

                if (model.tensors.find(name.data()) == model.tensors.end()) {
                    fprintf(stderr, "%s: unknown tensor '%s' in model file\n", __func__, name.data());
                    return false;
                }

                // split_type = 0: split by columns
                // split_type = 1: split by rows
                int split_type = 0;

                // split_type = 0:
                // regex:
                //   - tok_embeddings.*
                //   - layers.*.attention.wo.weight
                //   - layers.*.feed_forward.w2.weight

                // split_type = 1:
                // regex:
                //   - output.*
                //   - layers.*.attention.wq.weight
                //   - layers.*.attention.wk.weight
                //   - layers.*.attention.wv.weight
                //   - layers.*.feed_forward.w1.weight
                //   - layers.*.feed_forward.w3.weight
                if (name.find("tok_embeddings") != std::string::npos) {
                    split_type = 0;
                } else if (name.find("layers") != std::string::npos) {
                    if (name.find("attention.wo.weight") != std::string::npos) {
                        split_type = 0;
                    } else if (name.find("feed_forward.w2.weight") != std::string::npos) {
                        split_type = 0;
                    } else {
                        split_type = 1;
                    }
                } else if (name.find("output") != std::string::npos) {
                    split_type = 1;
                }

                auto tensor = model.tensors[name.data()];

                if (n_dims == 1) {
                    if (ggml_nelements(tensor) != nelements) {
                        fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.data());
                        return false;
                    }
                } else {
                    if (ggml_nelements(tensor)/n_parts != nelements) {
                        fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.data());
                        return false;
                    }
                }

                if (n_dims == 1) {
                    if (tensor->ne[0] != ne[0] || tensor->ne[1] != ne[1]) {
                        fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                                __func__, name.data(), tensor->ne[0], tensor->ne[1], ne[0], ne[1]);
                        return false;
                    }
                } else {
                    if (split_type == 0) {
                        if (tensor->ne[0]/n_parts != ne[0] || tensor->ne[1] != ne[1]) {
                            fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                                    __func__, name.data(), tensor->ne[0]/n_parts, tensor->ne[1], ne[0], ne[1]);
                            return false;
                        }
                    } else {
                        if (tensor->ne[0] != ne[0] || tensor->ne[1]/n_parts != ne[1]) {
                            fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                                    __func__, name.data(), tensor->ne[0], tensor->ne[1]/n_parts, ne[0], ne[1]);
                            return false;
                        }
                    }
                }

                if (0) {
                    static const char * ftype_str[] = { "f32", "f16", "q4_0", "q4_1", };
                    fprintf(stderr, "%24s - [%5d, %5d], type = %6s, split = %d\n", name.data(), ne[0], ne[1], ftype_str[ftype], split_type);
                }

                size_t bpe = 0;

                switch (ftype) {
                    case 0: bpe = ggml_type_size(GGML_TYPE_F32);  break;
                    case 1: bpe = ggml_type_size(GGML_TYPE_F16);  break;
                    case 2: bpe = ggml_type_size(GGML_TYPE_Q4_0); assert(ne[0] % 64 == 0); break;
                    case 3: bpe = ggml_type_size(GGML_TYPE_Q4_1); assert(ne[0] % 64 == 0); break;
                    default:
                            {
                                fprintf(stderr, "%s: unknown ftype %d in model file\n", __func__, ftype);
                                return false;
                            }
                };

                if (n_dims == 1 || n_parts == 1) {
                    if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)) {
                        fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                                __func__, name.data(), ggml_nbytes(tensor), nelements*bpe);
                        return false;
                    }

                    if (part_id == 0) {
                        fin.read(reinterpret_cast<char *>(tensor->data), ggml_nbytes(tensor));
                    } else {
                        fin.seekg(ggml_nbytes(tensor), std::ios::cur);
                    }

                    total_size += ggml_nbytes(tensor);
                } else {
                    if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)/n_parts) {
                        fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                                __func__, name.data(), ggml_nbytes(tensor)/n_parts, nelements*bpe);
                        return false;
                    }

                    if (split_type == 0) {
                        const int np0 = ne[0];

                        const size_t row_size = (tensor->ne[0]/ggml_blck_size(tensor->type))*ggml_type_size(tensor->type);
                        assert(row_size == tensor->nb[1]);

                        for (int i1 = 0; i1 < ne[1]; ++i1) {
                            const size_t offset_row = i1*row_size;
                            const size_t offset = offset_row + ((part_id*np0)/ggml_blck_size(tensor->type))*ggml_type_size(tensor->type);
                            fin.read(reinterpret_cast<char *>(tensor->data) + offset, row_size/n_parts);
                        }
                    } else {
                        const int np1 = ne[1];

                        const size_t row_size = (tensor->ne[0]/ggml_blck_size(tensor->type))*ggml_type_size(tensor->type);

                        for (int i1 = 0; i1 < ne[1]; ++i1) {
                            const size_t offset_row = (i1 + part_id*np1)*row_size;
                            fin.read(reinterpret_cast<char *>(tensor->data) + offset_row, row_size);
                        }
                    }

                    total_size += ggml_nbytes(tensor)/n_parts;
                }

                //fprintf(stderr, "%42s - [%5d, %5d], type = %6s, %6.2f MB\n", name.data(), ne[0], ne[1], ftype == 0 ? "float" : "f16", ggml_nbytes(tensor)/1024.0/1024.0);
                if (++n_tensors % 8 == 0) {
                    fprintf(stderr, ".");
                    fflush(stderr);
                }
            }

            fprintf(stderr, " done\n");

            fprintf(stderr, "%s: model size = %8.2f MB / num tensors = %d\n", __func__, total_size/1024.0/1024.0, n_tensors);
        }

        fin.close();
    }

    return true;
}